

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

RuntimeArray * __thiscall
spvtools::opt::InstrumentPass::GetRuntimeArray(InstrumentPass *this,Type *element)

{
  int iVar1;
  IRContext *this_00;
  TypeManager *this_01;
  Type *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar3;
  Type *type;
  RuntimeArray r;
  Type *element_local;
  InstrumentPass *this_local;
  
  r.element_type_ = element;
  analysis::RuntimeArray::RuntimeArray((RuntimeArray *)&type,element);
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_type_mgr(this_00);
  pTVar2 = analysis::TypeManager::GetRegisteredType(this_01,(Type *)&type);
  bVar3 = false;
  if (pTVar2 != (Type *)0x0) {
    iVar1 = (*pTVar2->_vptr_Type[0x19])();
    bVar3 = CONCAT44(extraout_var,iVar1) != 0;
  }
  if (!bVar3) {
    __assert_fail("type && type->AsRuntimeArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                  ,0x192,
                  "analysis::RuntimeArray *spvtools::opt::InstrumentPass::GetRuntimeArray(const analysis::Type *)"
                 );
  }
  iVar1 = (*pTVar2->_vptr_Type[0x19])();
  analysis::RuntimeArray::~RuntimeArray((RuntimeArray *)&type);
  return (RuntimeArray *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

analysis::RuntimeArray* InstrumentPass::GetRuntimeArray(
    const analysis::Type* element) {
  analysis::RuntimeArray r(element);
  analysis::Type* type = context()->get_type_mgr()->GetRegisteredType(&r);
  assert(type && type->AsRuntimeArray());
  return type->AsRuntimeArray();
}